

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

void __thiscall
DCanvas::FlatFill(DCanvas *this,int left,int top,int right,int bottom,FTexture *src,bool param_6)

{
  ushort uVar1;
  ushort uVar2;
  undefined4 in_register_00000014;
  undefined8 uVar3;
  undefined4 in_register_00000084;
  int iVar4;
  
  uVar3 = CONCAT44(in_register_00000014,top);
  uVar1 = src->Width;
  uVar2 = src->Height;
  if (!param_6) {
    top = top - top % (int)(uint)uVar2;
  }
  for (; top < bottom; top = top + (uint)uVar2) {
    iVar4 = left;
    if (!param_6) {
      iVar4 = left - left % (int)(uint)uVar1;
    }
    for (; iVar4 < right; iVar4 = iVar4 + (uint)uVar1) {
      DrawTexture(this,src,(double)iVar4,(double)top,0x400013a3,(ulong)(uint)left,0x400013a4,
                  (ulong)(uint)right,0x400013a1,uVar3,0x400013a2,
                  CONCAT44(in_register_00000084,bottom),0x4000139b,0,0x4000139c,0,0);
    }
  }
  return;
}

Assistant:

void DCanvas::FlatFill (int left, int top, int right, int bottom, FTexture *src, bool local_origin)
{
	int w = src->GetWidth();
	int h = src->GetHeight();

	// Repeatedly draw the texture, left-to-right, top-to-bottom.
	for (int y = local_origin ? top : (top / h * h); y < bottom; y += h)
	{
		for (int x = local_origin ? left : (left / w * w); x < right; x += w)
		{
			DrawTexture (src, x, y,
				DTA_ClipLeft, left,
				DTA_ClipRight, right,
				DTA_ClipTop, top,
				DTA_ClipBottom, bottom,
				DTA_TopOffset, 0,
				DTA_LeftOffset, 0,
				TAG_DONE);
		}
	}
}